

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateTransformFeedbackShaderCaseBlocks
               (Context *context,TestCaseGroup *targetGroup,GLSLVersion glslVersion,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_bool *blockContentGenerator)

{
  deInt32 *pdVar1;
  GLSLVersion GVar2;
  TestNode *pTVar3;
  Node *pNVar4;
  ShaderSet *pSVar5;
  SharedPtrStateBase *pSVar6;
  long lVar7;
  SharedPtr shaderSet;
  SharedPtr program;
  SharedPtr local_68;
  SharedPtr local_58;
  GLSLVersion local_44;
  _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_bool *local_40;
  TestNode *local_38;
  
  lVar7 = 0x10;
  local_44 = glslVersion;
  local_40 = blockContentGenerator;
  local_38 = &targetGroup->super_TestNode;
  do {
    pTVar3 = (TestNode *)operator_new(0x78);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar3,context->m_testCtx,
               *(char **)((long)&PTR_typeinfo_021a79e0 + lVar7),
               glcts::fixed_sample_locations_values + 1);
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
    pTVar3[1]._vptr_TestNode = (_func_int **)context;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->m_type = TYPE_PROGRAM;
    (pNVar4->m_enclosingNode).m_ptr = (Node *)0x0;
    (pNVar4->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a6eb0;
    *(undefined1 *)&pNVar4[1]._vptr_Node = 0;
    local_58.m_state = (SharedPtrStateBase *)0x0;
    local_58.m_ptr = pNVar4;
    local_58.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_58.m_state)->strongRefCount = 0;
    (local_58.m_state)->weakRefCount = 0;
    (local_58.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    local_58.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    (local_58.m_state)->strongRefCount = 1;
    (local_58.m_state)->weakRefCount = 1;
    pSVar5 = (ShaderSet *)operator_new(0x30);
    ResourceDefinition::ShaderSet::ShaderSet
              (pSVar5,&local_58,local_44,*(deUint32 *)(&UNK_021a79e8 + lVar7),
               *(deUint32 *)(&UNK_021a79ec + lVar7));
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = (Node *)pSVar5;
    local_68.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_68.m_state)->strongRefCount = 0;
    (local_68.m_state)->weakRefCount = 0;
    (local_68.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    local_68.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pSVar5;
    (local_68.m_state)->strongRefCount = 1;
    (local_68.m_state)->weakRefCount = 1;
    tcu::TestNode::addChild(local_38,pTVar3);
    (*local_40)(context,&local_68,(TestCaseGroup *)pTVar3,
                *(bool *)((long)&generateTransformFeedbackShaderCaseBlocks::pipelines[0].name +
                         lVar7));
    if (local_68.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_68.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_68.m_ptr = (Node *)0x0;
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_68.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_68.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_68.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_58.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_58.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_58.m_ptr = (Node *)0x0;
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_58.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_58.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_58.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x70);
  lVar7 = 0xc;
  do {
    pTVar3 = (TestNode *)operator_new(0x78);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar3,context->m_testCtx,
               *(char **)((long)&generateTransformFeedbackShaderCaseBlocks::pipelines[3].
                                 lastStageBit + lVar7),glcts::fixed_sample_locations_values + 1);
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
    pTVar3[1]._vptr_TestNode = (_func_int **)context;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->m_type = TYPE_PROGRAM;
    (pNVar4->m_enclosingNode).m_ptr = (Node *)0x0;
    (pNVar4->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a6eb0;
    *(undefined1 *)&pNVar4[1]._vptr_Node = 1;
    local_58.m_state = (SharedPtrStateBase *)0x0;
    local_58.m_ptr = pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_58.m_state = pSVar6;
    pSVar5 = (ShaderSet *)operator_new(0x28);
    GVar2 = *(GLSLVersion *)
             (&generateTransformFeedbackShaderCaseBlocks::pipelines[3].field_0x14 + lVar7);
    (pSVar5->super_Node)._vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    (pSVar5->super_Node).m_type = TYPE_SHADER;
    (pSVar5->super_Node).m_enclosingNode.m_ptr = pNVar4;
    (pSVar5->super_Node).m_enclosingNode.m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pSVar5->super_Node).m_enclosingNode.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    (pSVar5->super_Node)._vptr_Node = (_func_int **)&PTR__Node_021a6f58;
    pSVar5->m_version = GVar2;
    *(GLSLVersion *)pSVar5->m_stagePresent = local_44;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = (Node *)pSVar5;
    local_68.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_68.m_state)->strongRefCount = 0;
    (local_68.m_state)->weakRefCount = 0;
    (local_68.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    local_68.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pSVar5;
    (local_68.m_state)->strongRefCount = 1;
    (local_68.m_state)->weakRefCount = 1;
    tcu::TestNode::addChild(local_38,pTVar3);
    (*local_40)(context,&local_68,(TestCaseGroup *)pTVar3,
                *(bool *)((long)&generateTransformFeedbackShaderCaseBlocks::singleStageCases[0].name
                         + lVar7));
    if (local_68.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_68.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_68.m_ptr = (Node *)0x0;
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_68.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_68.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_68.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_58.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_58.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_58.m_ptr = (Node *)0x0;
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_58.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_58.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_58.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x3c);
  return;
}

Assistant:

static void generateTransformFeedbackShaderCaseBlocks (Context& context, tcu::TestCaseGroup* targetGroup, glu::GLSLVersion glslVersion, void (*blockContentGenerator)(Context&, const ResourceDefinition::Node::SharedPtr&, tcu::TestCaseGroup*, bool))
{
	static const struct
	{
		const char*	name;
		deUint32	stageBits;
		deUint32	lastStageBit;
		bool		reducedSet;
	} pipelines[] =
	{
		{
			"vertex_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT),
			(1 << glu::SHADERTYPE_VERTEX),
			false
		},
		{
			"vertex_tess_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION),
			(1 << glu::SHADERTYPE_TESSELLATION_EVALUATION),
			true
		},
		{
			"vertex_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_GEOMETRY),
			(1 << glu::SHADERTYPE_GEOMETRY),
			true
		},
		{
			"vertex_tess_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION) | (1 << glu::SHADERTYPE_GEOMETRY),
			(1 << glu::SHADERTYPE_GEOMETRY),
			true
		},
	};
	static const struct
	{
		const char*		name;
		glu::ShaderType	stage;
		bool			reducedSet;
	} singleStageCases[] =
	{
		{ "separable_vertex",		glu::SHADERTYPE_VERTEX,						false	},
		{ "separable_tess_eval",	glu::SHADERTYPE_TESSELLATION_EVALUATION,	true	},
		{ "separable_geometry",		glu::SHADERTYPE_GEOMETRY,					true	},
	};

	// monolithic pipeline
	for (int pipelineNdx = 0; pipelineNdx < DE_LENGTH_OF_ARRAY(pipelines); ++pipelineNdx)
	{
		TestCaseGroup* const						blockGroup		= new TestCaseGroup(context, pipelines[pipelineNdx].name, "");
		const ResourceDefinition::Node::SharedPtr	program			(new ResourceDefinition::Program());
		const ResourceDefinition::Node::SharedPtr	shaderSet		(new ResourceDefinition::ShaderSet(program,
																									   glslVersion,
																									   pipelines[pipelineNdx].stageBits,
																									   pipelines[pipelineNdx].lastStageBit));

		targetGroup->addChild(blockGroup);
		blockContentGenerator(context, shaderSet, blockGroup, pipelines[pipelineNdx].reducedSet);
	}

	// separable pipeline
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(singleStageCases); ++ndx)
	{
		TestCaseGroup* const						blockGroup			= new TestCaseGroup(context, singleStageCases[ndx].name, "");
		const ResourceDefinition::Node::SharedPtr	program				(new ResourceDefinition::Program(true));
		const ResourceDefinition::Node::SharedPtr	shader				(new ResourceDefinition::Shader(program, singleStageCases[ndx].stage, glslVersion));

		targetGroup->addChild(blockGroup);
		blockContentGenerator(context, shader, blockGroup, singleStageCases[ndx].reducedSet);
	}
}